

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * get_driver(string *tty)

{
  int iVar1;
  char *pcVar2;
  ssize_t sVar3;
  string *in_RSI;
  allocator local_4e1;
  undefined4 local_4e0;
  allocator local_4d9;
  char local_4d8 [8];
  char buffer [1024];
  string local_c8 [8];
  string devicedir;
  undefined1 local_a8 [8];
  stat st;
  string *tty_local;
  
  std::__cxx11::string::string(local_c8,in_RSI);
  std::__cxx11::string::operator+=(local_c8,"/device");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = lstat(pcVar2,(stat *)local_a8);
  if ((iVar1 == 0) && (((uint)st.st_nlink & 0xf000) == 0xa000)) {
    memset(local_4d8,0,0x400);
    std::__cxx11::string::operator+=(local_c8,"/driver");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    sVar3 = readlink(pcVar2,local_4d8,0x400);
    if (0 < sVar3) {
      pcVar2 = basename(local_4d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)tty,pcVar2,&local_4d9);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
      goto LAB_00105ccc;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)tty,"",&local_4e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
LAB_00105ccc:
  local_4e0 = 1;
  std::__cxx11::string::~string(local_c8);
  return tty;
}

Assistant:

string get_driver(const string& tty) {
    struct stat st;
    string devicedir = tty;

    // Append '/device' to the tty-path
    devicedir += "/device";

    // Stat the devicedir and handle it if it is a symlink
    if (lstat(devicedir.c_str(), &st)==0 && S_ISLNK(st.st_mode)) {
        char buffer[1024];
        memset(buffer, 0, sizeof(buffer));

        // Append '/driver' and return basename of the target
        devicedir += "/driver";

        if (readlink(devicedir.c_str(), buffer, sizeof(buffer)) > 0)
            return basename(buffer);
    }
    return "";
}